

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

ostream * operator<<(ostream *output,sax_event_t *event)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer pbVar4;
  string local_50;
  
  switch(event->type) {
  case invalid_type:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "invalid";
    break;
  case start_document:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "start_document";
    break;
  case finish_document:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "finish_document";
    break;
  case comment:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"comment");
    poVar2 = std::operator<<(poVar2,", \'");
    escape_string(&local_50,&event->string_data);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\'}");
    goto LAB_00157e30;
  case table:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"table");
    std::operator<<(poVar2,", {");
    bVar1 = true;
    for (pbVar4 = (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      if (!bVar1) {
        std::operator<<(output,", ");
      }
      poVar2 = std::operator<<(output,"\'");
      escape_string(&local_50,pbVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      std::operator<<(poVar2,"\'");
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = false;
    }
    goto LAB_00157d63;
  case table_array_item:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"table_array_item");
    std::operator<<(poVar2,", {");
    bVar1 = true;
    for (pbVar4 = (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      if (!bVar1) {
        std::operator<<(output,", ");
      }
      poVar2 = std::operator<<(output,"\'");
      escape_string(&local_50,pbVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      std::operator<<(poVar2,"\'");
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = false;
    }
LAB_00157d63:
    pcVar3 = "}}";
    poVar2 = output;
    goto LAB_00157e97;
  case key:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"key");
    poVar2 = std::operator<<(poVar2,", \'");
    escape_string(&local_50,&event->string_data);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\'}");
    goto LAB_00157e30;
  case start_array:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "start_array";
    break;
  case finish_array:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "finish_array";
    goto LAB_00157e6a;
  case start_inline_table:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "start_inline_table";
    break;
  case finish_inline_table:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "finish_inline_table";
    goto LAB_00157e6a;
  case boolean:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"boolean");
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    goto LAB_00157e8d;
  case string:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"string");
    poVar2 = std::operator<<(poVar2,", \'");
    escape_string(&local_50,&event->string_data);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\'}");
    goto LAB_00157e30;
  case datetime:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"datetime");
    poVar2 = std::operator<<(poVar2,", \'");
    escape_string(&local_50,&event->string_data);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\'}");
LAB_00157e30:
    std::__cxx11::string::~string((string *)&local_50);
    return output;
  case integer:
    poVar2 = std::operator<<(output,"{");
    pcVar3 = "integer";
LAB_00157e6a:
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    goto LAB_00157e8d;
  case floating_point:
    poVar2 = std::operator<<(output,"{");
    poVar2 = std::operator<<(poVar2,"floating_point");
    std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<double>(event->float_data);
    goto LAB_00157e8d;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/common.hpp"
                  ,0xdd,"std::ostream &operator<<(std::ostream &, const sax_event_t &)");
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
LAB_00157e8d:
  pcVar3 = "}";
LAB_00157e97:
  std::operator<<(poVar2,pcVar3);
  return output;
}

Assistant:

inline std::ostream &operator<<(std::ostream &output, const sax_event_t &event) {
    switch(event.type) {
    case sax_event_t::invalid_type: {
        output << "{" << "invalid" << "}";
    } break;
    case sax_event_t::start_document: {
        output << "{" << "start_document" << "}";
    } break;
    case sax_event_t::finish_document: {
        output << "{" << "finish_document" << "}";
    } break;
    case sax_event_t::comment: {
        output << "{" << "comment" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::table: {
        output << "{" << "table" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::table_array_item: {
        output << "{" << "table_array_item" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::key: {
        output << "{" << "key" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::start_array: {
        output << "{" << "start_array" << "}";
    } break;
    case sax_event_t::finish_array: {
        output << "{" << "finish_array" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::start_inline_table: {
        output << "{" << "start_inline_table" << "}";
    } break;
    case sax_event_t::finish_inline_table: {
        output << "{" << "finish_inline_table" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::boolean: {
        output << "{" << "boolean" << ", " << event.bool_data << "}";
    } break;
    case sax_event_t::string: {
        output << "{" << "string" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::datetime: {
        output << "{" << "datetime" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::integer: {
        output << "{" << "integer" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::floating_point: {
        output << "{" << "floating_point" << ", " << event.float_data << "}";
    } break;
    default: assert(false);
    }

    return output;
}